

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O0

void __thiscall
MeshDenoisingBase::getFaceArea
          (MeshDenoisingBase *this,TriMesh *mesh,vector<double,_std::allocator<double>_> *area)

{
  undefined8 this_00;
  bool bVar1;
  value_type _vh;
  int iVar2;
  size_type __new_size;
  reference pvVar3;
  Point *pPVar4;
  reference pvVar5;
  reference pvVar6;
  BaseHandle *this_01;
  reference pvVar7;
  double dVar8;
  VectorT<double,_3> local_f0;
  double local_d8;
  double S;
  Point edge2;
  Point edge1;
  undefined1 local_80 [8];
  FaceVertexIter fv_it;
  int index;
  undefined1 local_58 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> point;
  undefined1 local_30 [8];
  FaceIter f_it;
  vector<double,_std::allocator<double>_> *area_local;
  TriMesh *mesh_local;
  MeshDenoisingBase *this_local;
  
  f_it._8_8_ = area;
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))();
  std::vector<double,_std::allocator<double>_>::resize(area,__new_size);
  _local_30 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    bVar1 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_30,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)&point.
                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
    vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)
           local_58);
    std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
    resize((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)
           local_58,3);
    fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ = 0;
    pvVar3 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_30);
    OpenMesh::PolyConnectivity::fv_iter
              ((FaceVertexIter *)local_80,(PolyConnectivity *)mesh,
               (FaceHandle)(pvVar3->super_BaseHandle).idx_);
    while( true ) {
      bVar1 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
              ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                          *)local_80);
      if (!bVar1) break;
      _vh = OpenMesh::Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                         *)local_80);
      pPVar4 = OpenMesh::
               AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
               point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      *)mesh,(VertexHandle)_vh.super_BaseHandle.idx_);
      pvVar5 = std::
               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             *)local_58,
                            (long)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                                  lap_counter_);
      (pvVar5->super_VectorDataT<double,_3>).values_[0] =
           (pPVar4->super_VectorDataT<double,_3>).values_[0];
      (pvVar5->super_VectorDataT<double,_3>).values_[1] =
           (pPVar4->super_VectorDataT<double,_3>).values_[1];
      (pvVar5->super_VectorDataT<double,_3>).values_[2] =
           (pPVar4->super_VectorDataT<double,_3>).values_[2];
      fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
           fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ + 1;
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    *)(edge1.super_VectorDataT<double,_3>.values_ + 2),
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    *)local_80,0);
    }
    pvVar5 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         *)local_58,1);
    pvVar6 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         *)local_58,0);
    OpenMesh::VectorT<double,_3>::operator-
              ((vector_type *)(edge2.super_VectorDataT<double,_3>.values_ + 2),pvVar5,pvVar6);
    pvVar5 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         *)local_58,1);
    pvVar6 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         *)local_58,2);
    OpenMesh::VectorT<double,_3>::operator-((vector_type *)&S,pvVar5,pvVar6);
    OpenMesh::VectorT<double,_3>::operator%
              (&local_f0,(VectorT<double,_3> *)(edge2.super_VectorDataT<double,_3>.values_ + 2),
               (VectorT<double,_3> *)&S);
    dVar8 = OpenMesh::VectorT<double,_3>::length(&local_f0);
    this_00 = f_it._8_8_;
    local_d8 = dVar8 * 0.5;
    this_01 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_30)->super_BaseHandle;
    iVar2 = OpenMesh::BaseHandle::idx(this_01);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this_00,(long)iVar2);
    *pvVar7 = dVar8 * 0.5;
    std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
    ~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)
            local_58);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_30,0);
  }
  return;
}

Assistant:

void MeshDenoisingBase::getFaceArea(TriMesh &mesh, std::vector<double> &area)
{
    area.resize(mesh.n_faces());

    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        std::vector<TriMesh::Point> point;
        point.resize(3); int index = 0;
        for(TriMesh::FaceVertexIter fv_it = mesh.fv_iter(*f_it); fv_it.is_valid(); fv_it++)
        {
            point[index] = mesh.point(*fv_it);
            index++;
        }
        TriMesh::Point edge1 = point[1] - point[0];
        TriMesh::Point edge2 = point[1] - point[2];
        double S = 0.5 * (edge1 % edge2).length();
        area[(*f_it).idx()] = S;
    }
}